

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  size_type sVar1;
  cmCTest *pcVar2;
  cmMakefile *pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  cmValue cVar8;
  cmCTestGenericHandler *pcVar9;
  cmake *gname;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  char *pcVar13;
  string *this_00;
  string *option;
  pointer pbVar14;
  string_view arg;
  allocator<char> local_271;
  string cmakeConfigureCommand;
  undefined1 local_250 [16];
  cmAlphaNum local_240;
  _Base_ptr local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  undefined1 local_1e8 [32];
  string cmakelists_file;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar1 = (this->Options)._M_string_length;
  if (sVar1 != 0) {
    arg._M_str = (this->Options)._M_dataplus._M_p;
    arg._M_len = sVar1;
    cmExpandList(arg,&options,false);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_250 + 0x10),"BuildDirectory",(allocator<char> *)local_1e8);
  cmCTest::GetCTestConfiguration((string *)&e,pcVar2,(string *)(local_250 + 0x10));
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)(local_250 + 0x10));
  if (local_1a0[0]._M_allocated_capacity == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator<char> *)(local_250 + 0x10));
    cmCommand::SetError((cmCommand *)this,(string *)&e);
LAB_004a8c30:
    this_00 = (string *)&e;
LAB_004a8c38:
    std::__cxx11::string::~string(this_00);
  }
  else {
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CTEST_CONFIGURE_COMMAND",(allocator<char> *)(local_250 + 0x10));
    cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
LAB_004a8a26:
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CTEST_LABELS_FOR_SUBPROJECTS",(allocator<char> *)(local_250 + 0x10));
      cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (cVar8.Value != (string *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   "LabelsForSubprojects",cVar8.Value,(this->super_cmCTestHandlerCommand).Quiet);
      }
      pcVar9 = &cmCTest::GetConfigureHandler
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->
                super_cmCTestGenericHandler;
      (*((cmCTestGenericHandler *)&pcVar9->_vptr_cmCTestGenericHandler)->_vptr_cmCTestGenericHandler
        [3])(pcVar9);
      pcVar9->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_004a8c40;
    }
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CTEST_CMAKE_GENERATOR",(allocator<char> *)(local_250 + 0x10));
    cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if ((cVar8.Value == (string *)0x0) || ((cVar8.Value)->_M_string_length == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator<char> *)(local_250 + 0x10));
      cmCommand::SetError((cmCommand *)this,(string *)&e);
      goto LAB_004a8c30;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_210 = (_Base_ptr)cVar8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"SourceDirectory",(allocator<char> *)(local_250 + 0x10));
    cmCTest::GetCTestConfiguration((string *)local_1e8,pcVar2,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (local_1e8._8_8_ == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator<char> *)(local_250 + 0x10));
      cmCommand::SetError((cmCommand *)this,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      this_00 = (string *)local_1e8;
      goto LAB_004a8c38;
    }
    std::operator+(&cmakelists_file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   "/CMakeLists.txt");
    bVar6 = cmsys::SystemTools::FileExists(&cmakelists_file);
    if (bVar6) {
      gname = cmMakefile::GetCMakeInstance
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      cmake::CreateGlobalGenerator((cmake *)local_250,(string *)gname,SUB81(local_210,0));
      if ((pointer)local_250._0_8_ == (pointer)0x0) {
        local_250._12_4_ = 0;
      }
      else {
        local_250._12_4_ =
             (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                          *)local_250._0_8_)->
                       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[0x26].
                       _vptr_cmGlobalGeneratorFactory)();
        uVar4 = local_250._0_8_;
        local_250._0_8_ = (pointer)0x0;
        if ((pointer)uVar4 != (pointer)0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)uVar4)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
      }
      _e = &DAT_00000001;
      psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_240.View_._M_str = (psVar11->_M_dataplus)._M_p;
      local_240.View_._M_len = psVar11->_M_string_length;
      local_271 = (allocator<char>)0x22;
      cmStrCat<char>(&cmakeConfigureCommand,(cmAlphaNum *)&e,(cmAlphaNum *)(local_250 + 0x10),
                     (char *)&local_271);
      pbVar5 = options.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar7 = false;
      for (pbVar14 = options.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar5;
          pbVar14 = pbVar14 + 1) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        pcVar13 = (pbVar14->_M_dataplus)._M_p;
        pcVar12 = strstr(pcVar13,"CMAKE_BUILD_TYPE=");
        if ((pcVar12 != (char *)0x0) ||
           (pcVar13 = strstr(pcVar13,"CMAKE_BUILD_TYPE:STRING="), pcVar13 != (char *)0x0)) {
          bVar7 = true;
        }
      }
      if (((local_250._12_4_ & 1) == 0 && !bVar7) &&
         (psVar11 = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
         psVar11->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        cmCTest::GetConfigType_abi_cxx11_
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CTEST_USE_LAUNCHERS",(allocator<char> *)(local_250 + 0x10));
      bVar7 = cmMakefile::IsOn(pcVar3,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (bVar7) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      std::__cxx11::string::append((string *)&cmakeConfigureCommand);
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CTEST_CMAKE_GENERATOR_PLATFORM",(allocator<char> *)(local_250 + 0x10)
                );
      cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CTEST_CMAKE_GENERATOR_TOOLSET",(allocator<char> *)(local_250 + 0x10))
      ;
      cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      std::__cxx11::string::append((string *)&cmakeConfigureCommand);
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_250 + 0x10),"BuildDirectory",&local_271);
      cmCTest::GetCTestConfiguration((string *)&e,pcVar2,(string *)(local_250 + 0x10));
      std::__cxx11::string::append((string *)&cmakeConfigureCommand);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)(local_250 + 0x10));
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 &cmakeConfigureCommand,(this->super_cmCTestHandlerCommand).Quiet);
      std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
      if ((pointer)local_250._0_8_ != (pointer)0x0) {
        (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                     *)local_250._0_8_)->
                  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                  _vptr_cmGlobalGeneratorFactory)();
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar10 = std::operator<<((ostream *)&e,"CMakeLists.txt file does not exist [");
      poVar10 = std::operator<<(poVar10,(string *)&cmakelists_file);
      std::operator<<(poVar10,"]");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,(string *)(local_250 + 0x10));
      std::__cxx11::string::~string((string *)(local_250 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    std::__cxx11::string::~string((string *)&cmakelists_file);
    std::__cxx11::string::~string((string *)local_1e8);
    if (bVar6) goto LAB_004a8a26;
  }
  pcVar9 = (cmCTestGenericHandler *)0x0;
LAB_004a8c40:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&options);
  return pcVar9;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (!this->Options.empty()) {
    cmExpandList(this->Options, options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  cmValue ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (cmNonempty(ctestConfigureCommand)) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       *ctestConfigureCommand, this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmNonempty(cmakeGeneratorName)) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      auto gg = this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
        *cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        gg.reset();
      }

      std::string cmakeConfigureCommand =
        cmStrCat('"', cmSystemTools::GetCMakeCommand(), '"');

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += *cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      cmValue cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmNonempty(cmakeGeneratorPlatform)) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += *cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      cmValue cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmNonempty(cmakeGeneratorToolset)) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += *cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"-S";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      cmakeConfigureCommand += " \"-B";
      cmakeConfigureCommand +=
        this->CTest->GetCTestConfiguration("BuildDirectory");
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
                                         cmakeConfigureCommand, this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}